

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O1

void rgb_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  bool bVar5;
  ulong uVar6;
  JSAMPLE *pJVar7;
  
  if (0 < num_rows) {
    uVar1 = cinfo->image_width;
    do {
      if ((ulong)uVar1 != 0) {
        pJVar2 = (*output_buf)[output_row];
        pJVar3 = output_buf[1][output_row];
        pJVar4 = output_buf[2][output_row];
        pJVar7 = *input_buf;
        uVar6 = 0;
        do {
          pJVar2[uVar6] = *pJVar7;
          pJVar3[uVar6] = pJVar7[1];
          pJVar4[uVar6] = pJVar7[2];
          pJVar7 = pJVar7 + 3;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
      bVar5 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_convert (j_compress_ptr cinfo,
	     JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
	     JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr0, outptr1, outptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr0 = output_buf[0][output_row];
    outptr1 = output_buf[1][output_row];
    outptr2 = output_buf[2][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      /* We can dispense with GETJSAMPLE() here */
      outptr0[col] = inptr[RGB_RED];
      outptr1[col] = inptr[RGB_GREEN];
      outptr2[col] = inptr[RGB_BLUE];
      inptr += RGB_PIXELSIZE;
    }
  }
}